

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlRegFreeParserCtxt(xmlRegParserCtxtPtr ctxt)

{
  int local_14;
  int i;
  xmlRegParserCtxtPtr ctxt_local;
  
  if (ctxt != (xmlRegParserCtxtPtr)0x0) {
    if (ctxt->string != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->string);
    }
    if (ctxt->states != (xmlRegStatePtr *)0x0) {
      for (local_14 = 0; local_14 < ctxt->nbStates; local_14 = local_14 + 1) {
        xmlRegFreeState(ctxt->states[local_14]);
      }
      (*xmlFree)(ctxt->states);
    }
    if (ctxt->atoms != (xmlRegAtomPtr *)0x0) {
      for (local_14 = 0; local_14 < ctxt->nbAtoms; local_14 = local_14 + 1) {
        xmlRegFreeAtom(ctxt->atoms[local_14]);
      }
      (*xmlFree)(ctxt->atoms);
    }
    if (ctxt->counters != (xmlRegCounter *)0x0) {
      (*xmlFree)(ctxt->counters);
    }
    (*xmlFree)(ctxt);
  }
  return;
}

Assistant:

static void
xmlRegFreeParserCtxt(xmlRegParserCtxtPtr ctxt) {
    int i;
    if (ctxt == NULL)
	return;

    if (ctxt->string != NULL)
	xmlFree(ctxt->string);
    if (ctxt->states != NULL) {
	for (i = 0;i < ctxt->nbStates;i++)
	    xmlRegFreeState(ctxt->states[i]);
	xmlFree(ctxt->states);
    }
    if (ctxt->atoms != NULL) {
	for (i = 0;i < ctxt->nbAtoms;i++)
	    xmlRegFreeAtom(ctxt->atoms[i]);
	xmlFree(ctxt->atoms);
    }
    if (ctxt->counters != NULL)
	xmlFree(ctxt->counters);
    xmlFree(ctxt);
}